

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O2

Value * cmDumpCMakeInputs(Value *__return_storage_ptr__,cmake *cm)

{
  cmGlobalGenerator *gg;
  string *buildDir;
  string *sourceDir;
  Value *pVVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_01;
  Value tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmpFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explicitFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  internalFiles;
  Value local_1d8;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  gg = cm->GlobalGenerator;
  buildDir = cmake::GetHomeOutputDirectory_abi_cxx11_(cm);
  sourceDir = cmake::GetHomeDirectory_abi_cxx11_(cm);
  internalFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  internalFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  internalFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  explicitFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmpFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmpFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGetCMakeInputs(gg,sourceDir,buildDir,&internalFiles,&explicitFiles,&tmpFiles);
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  Json::Value::Value(&tmp,objectValue);
  Json::Value::Value(&local_48,true);
  pVVar1 = Json::Value::operator[](&tmp,&kIS_CMAKE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_70,false);
  pVVar1 = Json::Value::operator[](&tmp,&kIS_TEMPORARY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_70);
  Json::Value::~Value(&local_70);
  (anonymous_namespace)::
  fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_98,(_anonymous_namespace_ *)&internalFiles,in);
  pVVar1 = Json::Value::operator[](&tmp,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_98);
  Json::Value::~Value(&local_98);
  Json::Value::append(__return_storage_ptr__,&tmp);
  Json::Value::Value(&local_c0,objectValue);
  Json::Value::operator=(&tmp,&local_c0);
  Json::Value::~Value(&local_c0);
  Json::Value::Value(&local_e8,false);
  pVVar1 = Json::Value::operator[](&tmp,&kIS_CMAKE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_e8);
  Json::Value::~Value(&local_e8);
  Json::Value::Value(&local_110,false);
  pVVar1 = Json::Value::operator[](&tmp,&kIS_TEMPORARY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_110);
  Json::Value::~Value(&local_110);
  (anonymous_namespace)::
  fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_138,(_anonymous_namespace_ *)&explicitFiles,in_00);
  pVVar1 = Json::Value::operator[](&tmp,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_138);
  Json::Value::~Value(&local_138);
  Json::Value::append(__return_storage_ptr__,&tmp);
  Json::Value::Value(&local_160,objectValue);
  Json::Value::operator=(&tmp,&local_160);
  Json::Value::~Value(&local_160);
  Json::Value::Value(&local_188,false);
  pVVar1 = Json::Value::operator[](&tmp,&kIS_CMAKE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_188);
  Json::Value::~Value(&local_188);
  Json::Value::Value(&local_1b0,true);
  pVVar1 = Json::Value::operator[](&tmp,&kIS_TEMPORARY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_1b0);
  Json::Value::~Value(&local_1b0);
  (anonymous_namespace)::
  fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_1d8,(_anonymous_namespace_ *)&tmpFiles,in_01);
  pVVar1 = Json::Value::operator[](&tmp,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_1d8);
  Json::Value::~Value(&local_1d8);
  Json::Value::append(__return_storage_ptr__,&tmp);
  Json::Value::~Value(&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tmpFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&internalFiles);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmDumpCMakeInputs(const cmake* cm)
{
  const cmGlobalGenerator* gg = cm->GetGlobalGenerator();
  const std::string& buildDir = cm->GetHomeOutputDirectory();
  const std::string& sourceDir = cm->GetHomeDirectory();

  std::vector<std::string> internalFiles;
  std::vector<std::string> explicitFiles;
  std::vector<std::string> tmpFiles;
  cmGetCMakeInputs(gg, sourceDir, buildDir, &internalFiles, &explicitFiles,
                   &tmpFiles);

  Json::Value array = Json::arrayValue;

  Json::Value tmp = Json::objectValue;
  tmp[kIS_CMAKE_KEY] = true;
  tmp[kIS_TEMPORARY_KEY] = false;
  tmp[kSOURCES_KEY] = fromStringList(internalFiles);
  array.append(tmp);

  tmp = Json::objectValue;
  tmp[kIS_CMAKE_KEY] = false;
  tmp[kIS_TEMPORARY_KEY] = false;
  tmp[kSOURCES_KEY] = fromStringList(explicitFiles);
  array.append(tmp);

  tmp = Json::objectValue;
  tmp[kIS_CMAKE_KEY] = false;
  tmp[kIS_TEMPORARY_KEY] = true;
  tmp[kSOURCES_KEY] = fromStringList(tmpFiles);
  array.append(tmp);

  return array;
}